

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialize.c
# Opt level: O0

float_type init_permeability_object_2D(float_type posX,float_type posY,void *user)

{
  middle_object_2D *mo;
  void *user_local;
  float_type posY_local;
  float_type posX_local;
  undefined8 local_8;
  
  if ((posX < *(double *)((long)user + 0x20) - *(double *)((long)user + 0x30) / 2.0) ||
     (*(double *)((long)user + 0x20) + *(double *)((long)user + 0x30) / 2.0 < posX)) {
    local_8 = *user;
  }
  else if ((posY < *(double *)((long)user + 0x28) - *(double *)((long)user + 0x38) / 2.0) ||
          (*(double *)((long)user + 0x28) + *(double *)((long)user + 0x38) / 2.0 < posY)) {
    local_8 = *user;
  }
  else {
    local_8 = *(float_type *)((long)user + 8);
  }
  return local_8;
}

Assistant:

static float_type init_permeability_object_2D(float_type posX, float_type posY,
                                              void *user) {
  struct middle_object_2D *mo = (struct middle_object_2D *)user;
  if (posX < mo->object_center[0] - mo->object_dimensions[0] / float_cst(2.) ||
      posX > mo->object_center[0] + mo->object_dimensions[0] / float_cst(2.)) {
    return mo->permeability_medium;
  } else {
    if (posY <
            mo->object_center[1] - mo->object_dimensions[1] / float_cst(2.) ||
        posY >
            mo->object_center[1] + mo->object_dimensions[1] / float_cst(2.)) {
      return mo->permeability_medium;
    } else {
      return mo->permeability_object;
    }
  }
}